

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

string * __thiscall
flatbuffers::lobster::LobsterGenerator::LobsterType_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  bool bVar1;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  LobsterGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (LobsterGenerator *)__return_storage_ptr__;
  bVar1 = IsFloat(type->base_type);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    bVar1 = IsBool(local_20->base_type);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bool",local_35);
      std::allocator<char>::~allocator(local_35);
    }
    else {
      bVar1 = IsScalar(local_20->base_type);
      if ((bVar1) && (local_20->enum_def != (EnumDef *)0x0)) {
        NormalizedName_abi_cxx11_(__return_storage_ptr__,this,&local_20->enum_def->super_Definition)
        ;
      }
      else {
        bVar1 = IsScalar(local_20->base_type);
        if (bVar1) {
          bVar1 = IsString(local_20);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"string",&local_37);
            std::allocator<char>::~allocator(&local_37);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"int",&local_38);
            std::allocator<char>::~allocator(&local_38);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"flatbuffers.offset",&local_36);
          std::allocator<char>::~allocator(&local_36);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LobsterType(const Type &type) {
    if (IsFloat(type.base_type)) return "float";
    if (IsBool(type.base_type)) return "bool";
    if (IsScalar(type.base_type) && type.enum_def)
      return NormalizedName(*type.enum_def);
    if (!IsScalar(type.base_type)) return "flatbuffers.offset";
    if (IsString(type)) return "string";
    return "int";
  }